

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

void gguf_write_to_buf(gguf_context *ctx,vector<signed_char,_std::allocator<signed_char>_> *buf,
                      bool only_meta)

{
  pointer *ppcVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  iterator iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int64_t n_tensors;
  gguf_writer gw;
  int64_t n_kv;
  size_t local_48;
  gguf_writer local_40;
  long local_38;
  
  local_38 = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  __n = ((long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
  iVar4._M_current =
       (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = __n;
  local_40.buf = buf;
  if (iVar4._M_current ==
      (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
              ((vector<signed_char,std::allocator<signed_char>> *)buf,iVar4,"GGUF");
    iVar4._M_current =
         (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = 'G';
    iVar4._M_current =
         (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current ==
      (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
              ((vector<signed_char,std::allocator<signed_char>> *)buf,iVar4,"GUF");
    iVar4._M_current =
         (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = 'G';
    iVar4._M_current =
         (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current ==
      (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
              ((vector<signed_char,std::allocator<signed_char>> *)buf,iVar4,"UF");
    iVar4._M_current =
         (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = 'U';
    iVar4._M_current =
         (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current ==
      (buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
              ((vector<signed_char,std::allocator<signed_char>> *)buf,iVar4,"F");
  }
  else {
    *iVar4._M_current = 'F';
    ppcVar1 = &(buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  gguf_writer::write<unsigned_int>(&local_40,&ctx->version);
  gguf_writer::write<long>(&local_40,(long *)&local_48);
  gguf_writer::write<long>(&local_40,&local_38);
  if (0 < local_38) {
    iVar6 = 0;
    lVar5 = 0;
    __buf = extraout_RDX;
    do {
      gguf_writer::write(&local_40,
                         (int)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>.
                              _M_impl.super__Vector_impl_data._M_start + iVar6,__buf,__n);
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + 0x58;
      __buf = extraout_RDX_00;
    } while (lVar5 < local_38);
  }
  if (0 < (long)local_48) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      gguf_writer::write_tensor_meta
                (&local_40,
                 (gguf_tensor_info *)
                 ((long)(((ctx->info).
                          super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                          _M_impl.super__Vector_impl_data._M_start)->t).ne + lVar7 + -0x10));
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x158;
    } while (lVar5 < (long)local_48);
  }
  gguf_writer::pad(&local_40,ctx->alignment);
  if ((!only_meta) && (0 < (long)local_48)) {
    pcVar2 = ((local_40.buf)->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    pcVar3 = ((local_40.buf)->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    lVar5 = 0;
    lVar7 = 0;
    do {
      gguf_writer::write_tensor_data
                (&local_40,
                 (gguf_tensor_info *)
                 ((long)(((ctx->info).
                          super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                          _M_impl.super__Vector_impl_data._M_start)->t).ne + lVar5 + -0x10),
                 (long)pcVar2 - (long)pcVar3,ctx->alignment);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x158;
    } while (lVar7 < (long)local_48);
  }
  return;
}

Assistant:

void gguf_write_to_buf(const struct gguf_context * ctx, std::vector<int8_t> & buf, bool only_meta) {
    const struct gguf_writer gw(buf);

    const int64_t n_kv      = gguf_get_n_kv(ctx);
    const int64_t n_tensors = gguf_get_n_tensors(ctx);

    // write header
    gw.write(GGUF_MAGIC[0]);
    gw.write(GGUF_MAGIC[1]);
    gw.write(GGUF_MAGIC[2]);
    gw.write(GGUF_MAGIC[3]);
    gw.write(ctx->version);
    gw.write(n_tensors);
    gw.write(n_kv);

    // write key-value pairs
    for (int64_t i = 0; i < n_kv; ++i) {
        gw.write(ctx->kv[i]);
    }

    // write tensor info
    for (int64_t i = 0; i < n_tensors; ++i) {
        gw.write_tensor_meta(ctx->info[i]);
    }

    // we require the data section to be aligned
    gw.pad(ctx->alignment);

    if (only_meta) {
        return;
    }

    const size_t offset_data = gw.buf.size();

    // write tensor data
    for (int64_t i = 0; i < n_tensors; ++i) {
        gw.write_tensor_data(ctx->info[i], offset_data, ctx->alignment);
    }
}